

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  pointer __dest;
  Index size;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Vector3 VStack_48;
  
  __dest = vel.storage_.data_;
  if (vel.storage_.super_extent_type<_1L>.size_.size_ != 3) {
    iDynTree::reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
    goto LAB_00110530;
  }
  getCenterOfMassVelocity(&VStack_48,this);
  uVar5 = 3;
  if (((undefined1  [16])vel.storage_ & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    uVar5 = (ulong)((uint)((ulong)__dest >> 3) & 1);
  }
  uVar6 = uVar5 ^ 3;
  uVar1 = (uint)(1 < uVar6) * 2;
  iVar2 = (int)uVar5;
  uVar4 = uVar1 + iVar2;
  if (uVar5 == 0) {
LAB_001104e5:
    uVar5 = (ulong)(uint)(iVar2 << 3);
    uVar3 = *(undefined8 *)((long)VStack_48.m_data + uVar5 + 8);
    *(undefined8 *)((long)__dest + uVar5) = *(undefined8 *)((long)VStack_48.m_data + uVar5);
    ((undefined8 *)((long)__dest + uVar5))[1] = uVar3;
  }
  else {
    memcpy(__dest,&VStack_48,(ulong)(uint)(iVar2 * 8));
    if (1 < (uint)uVar6) goto LAB_001104e5;
  }
  if (uVar4 < 3) {
    uVar5 = (ulong)(uVar4 * 8);
    memcpy((void *)((long)__dest + uVar5),(void *)((long)VStack_48.m_data + uVar5),
           (uVar6 - uVar1) * 8);
  }
LAB_00110530:
  return vel.storage_.super_extent_type<_1L>.size_.size_ == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassVelocity(Span<double> vel)
{
    constexpr int expected_velocity_size = 3;
    bool ok = vel.size() == expected_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCenterOfMassVelocity());

    return true;
}